

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decUtil.c
# Opt level: O1

uint Dec_GraphDeriveTruth(Dec_Graph_t *pGraph)

{
  Dec_Edge_t DVar1;
  Dec_Node_t *pDVar2;
  uint uVar3;
  uint *puVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  
  uVar3 = pGraph->nLeaves;
  if ((int)uVar3 < 0) {
    __assert_fail("Dec_GraphLeaveNum(pGraph) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/dec/decUtil.c"
                  ,0x6f,"unsigned int Dec_GraphDeriveTruth(Dec_Graph_t *)");
  }
  if (pGraph->nSize < (int)uVar3) {
    __assert_fail("Dec_GraphLeaveNum(pGraph) <= pGraph->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/dec/decUtil.c"
                  ,0x70,"unsigned int Dec_GraphDeriveTruth(Dec_Graph_t *)");
  }
  if (5 < (int)uVar3) {
    __assert_fail("Dec_GraphLeaveNum(pGraph) <= 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/dec/decUtil.c"
                  ,0x71,"unsigned int Dec_GraphDeriveTruth(Dec_Graph_t *)");
  }
  DVar1 = pGraph->eRoot;
  if (pGraph->fConst == 0) {
    uVar6 = (uint)DVar1 >> 1 & 0x3fffffff;
    if (uVar6 < uVar3) {
      if (((uint)DVar1 & 1) == 0) {
        if (uVar3 <= uVar6) {
LAB_008f0ae9:
          __assert_fail("Dec_GraphIsVar( pGraph )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/dec/dec.h"
                        ,0x218,"int Dec_GraphVarInt(Dec_Graph_t *)");
        }
        uVar3 = (&DAT_00ab8770)[uVar6];
      }
      else {
        if (uVar3 <= uVar6) goto LAB_008f0ae9;
        uVar3 = ~(&DAT_00ab8770)[uVar6];
      }
    }
    else {
      iVar7 = pGraph->nLeaves;
      if (0 < iVar7) {
        puVar4 = &DAT_00ab8770;
        lVar5 = 2;
        lVar8 = 0;
        do {
          *(ulong *)(&pGraph->pNodes->eEdge0 + lVar5) = (ulong)*puVar4;
          lVar8 = lVar8 + 1;
          iVar7 = pGraph->nLeaves;
          puVar4 = puVar4 + 1;
          lVar5 = lVar5 + 6;
        } while (lVar8 < iVar7);
      }
      uVar3 = 0;
      if (iVar7 < pGraph->nSize) {
        lVar8 = (long)iVar7;
        lVar5 = lVar8 * 0x18 + 8;
        do {
          pDVar2 = pGraph->pNodes;
          uVar3 = *(uint *)((long)pDVar2 + lVar5 + -8);
          uVar6 = *(uint *)((long)pDVar2 + lVar5 + -4);
          uVar3 = (-(uVar6 & 1) ^ pDVar2[uVar6 >> 1 & 0x3fffffff].field_2.iFunc) &
                  (-(uVar3 & 1) ^ pDVar2[uVar3 >> 1 & 0x3fffffff].field_2.iFunc);
          *(ulong *)(&(pDVar2->eEdge0).field_0x0 + lVar5) = (ulong)uVar3;
          lVar8 = lVar8 + 1;
          lVar5 = lVar5 + 0x18;
        } while (lVar8 < pGraph->nSize);
      }
      uVar3 = -((uint)pGraph->eRoot & 1) ^ uVar3;
    }
  }
  else {
    uVar3 = ((uint)DVar1 & 1) - 1;
  }
  return uVar3;
}

Assistant:

unsigned Dec_GraphDeriveTruth( Dec_Graph_t * pGraph )
{
    unsigned uTruths[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    unsigned uTruth = 0; // Suppress "might be used uninitialized"
    unsigned uTruth0, uTruth1;
    Dec_Node_t * pNode;
    int i;

    // sanity checks
    assert( Dec_GraphLeaveNum(pGraph) >= 0 );
    assert( Dec_GraphLeaveNum(pGraph) <= pGraph->nSize );
    assert( Dec_GraphLeaveNum(pGraph) <= 5 );

    // check for constant function
    if ( Dec_GraphIsConst(pGraph) )
        return Dec_GraphIsComplement(pGraph)? 0 : ~((unsigned)0);
    // check for a literal
    if ( Dec_GraphIsVar(pGraph) )
        return Dec_GraphIsComplement(pGraph)? ~uTruths[Dec_GraphVarInt(pGraph)] : uTruths[Dec_GraphVarInt(pGraph)];

    // assign the elementary variables
    Dec_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = (void *)(ABC_PTRUINT_T)uTruths[i];

    // compute the function for each internal node
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        uTruth0 = (unsigned)(ABC_PTRUINT_T)Dec_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc;
        uTruth1 = (unsigned)(ABC_PTRUINT_T)Dec_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc;
        uTruth0 = pNode->eEdge0.fCompl? ~uTruth0 : uTruth0;
        uTruth1 = pNode->eEdge1.fCompl? ~uTruth1 : uTruth1;
        uTruth = uTruth0 & uTruth1;
        pNode->pFunc = (void *)(ABC_PTRUINT_T)uTruth;
    }

    // complement the result if necessary
    return Dec_GraphIsComplement(pGraph)? ~uTruth : uTruth;
}